

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeFeaturesSection(WasmBinaryWriter *this)

{
  Module *pMVar1;
  char *__s;
  undefined *puVar2;
  pointer ppcVar3;
  int32_t start;
  undefined **ppuVar4;
  size_t sVar5;
  uint uVar6;
  char **f;
  undefined1 auVar7 [8];
  string_view name;
  string_view name_00;
  char *local_60;
  undefined1 auStack_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> features;
  
  pMVar1 = this->wasm;
  if ((pMVar1->hasFeaturesSection == true) && ((pMVar1->features).features != 0)) {
    auStack_58 = (undefined1  [8])0x0;
    features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar6 = 1; uVar6 < 0x3fffff; uVar6 = uVar6 * 2) {
      if (((pMVar1->features).features & uVar6) != 0) {
        ppuVar4 = &BinaryConsts::CustomSections::AtomicsFeature;
        switch(uVar6) {
        case 1:
          break;
        case 2:
          ppuVar4 = &BinaryConsts::CustomSections::MutableGlobalsFeature;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
switchD_00cbf20c_caseD_3:
          handle_unreachable("unexpected feature flag",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                             ,0x56f);
        case 4:
          ppuVar4 = &BinaryConsts::CustomSections::TruncSatFeature;
          break;
        case 8:
          ppuVar4 = &BinaryConsts::CustomSections::SIMD128Feature;
          break;
        default:
          if (uVar6 == 0x10) {
            ppuVar4 = &BinaryConsts::CustomSections::BulkMemoryFeature;
          }
          else if (uVar6 == 0x20) {
            ppuVar4 = &BinaryConsts::CustomSections::SignExtFeature;
          }
          else if (uVar6 == 0x40) {
            ppuVar4 = &BinaryConsts::CustomSections::ExceptionHandlingFeature;
          }
          else if (uVar6 == 0x80) {
            ppuVar4 = &BinaryConsts::CustomSections::TailCallFeature;
          }
          else if (uVar6 == 0x100) {
            ppuVar4 = (undefined **)&BinaryConsts::CustomSections::ReferenceTypesFeature;
          }
          else if (uVar6 == 0x200) {
            ppuVar4 = &BinaryConsts::CustomSections::MultivalueFeature;
          }
          else if (uVar6 == 0x400) {
            ppuVar4 = &BinaryConsts::CustomSections::GCFeature;
          }
          else if (uVar6 == 0x800) {
            ppuVar4 = &BinaryConsts::CustomSections::Memory64Feature;
          }
          else if (uVar6 == 0x1000) {
            ppuVar4 = &BinaryConsts::CustomSections::RelaxedSIMDFeature;
          }
          else if (uVar6 == 0x2000) {
            ppuVar4 = &BinaryConsts::CustomSections::ExtendedConstFeature;
          }
          else if (uVar6 == 0x4000) {
            ppuVar4 = (undefined **)&BinaryConsts::CustomSections::StringsFeature;
          }
          else if (uVar6 == 0x8000) {
            ppuVar4 = &BinaryConsts::CustomSections::MultiMemoryFeature;
          }
          else if (uVar6 == 0x10000) {
            ppuVar4 = &BinaryConsts::CustomSections::StackSwitchingFeature;
          }
          else if (uVar6 == 0x20000) {
            ppuVar4 = &BinaryConsts::CustomSections::SharedEverythingFeature;
          }
          else if (uVar6 == 0x40000) {
            ppuVar4 = &BinaryConsts::CustomSections::FP16Feature;
          }
          else if (uVar6 == 0x80000) {
            ppuVar4 = &BinaryConsts::CustomSections::BulkMemoryOptFeature;
          }
          else if (uVar6 == 0x100000) {
            ppuVar4 = &BinaryConsts::CustomSections::CallIndirectOverlongFeature;
          }
          else {
            if (uVar6 != 0x200000) goto switchD_00cbf20c_caseD_3;
            ppuVar4 = &BinaryConsts::CustomSections::CustomDescriptorsFeature;
          }
        }
        local_60 = *ppuVar4;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)auStack_58,&local_60);
      }
    }
    start = startSection<wasm::BinaryConsts::Section>(this,Custom);
    puVar2 = BinaryConsts::CustomSections::TargetFeatures;
    sVar5 = strlen(BinaryConsts::CustomSections::TargetFeatures);
    name._M_str = puVar2;
    name._M_len = sVar5;
    writeInlineString(this,name);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)features.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_58) >> 3));
    ppcVar3 = features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (auVar7 = auStack_58; auVar7 != (undefined1  [8])ppcVar3;
        auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
      BufferWithRandomAccess::operator<<(this->o,'+');
      __s = *(char **)auVar7;
      sVar5 = strlen(__s);
      name_00._M_str = __s;
      name_00._M_len = sVar5;
      writeInlineString(this,name_00);
    }
    finishSection(this,start);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)auStack_58);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeFeaturesSection() {
  if (!wasm->hasFeaturesSection || wasm->features.isMVP()) {
    return;
  }

  // TODO(tlively): unify feature names with rest of toolchain and use
  // FeatureSet::toString()
  auto toString = [](FeatureSet::Feature f) {
    switch (f) {
      case FeatureSet::Atomics:
        return BinaryConsts::CustomSections::AtomicsFeature;
      case FeatureSet::MutableGlobals:
        return BinaryConsts::CustomSections::MutableGlobalsFeature;
      case FeatureSet::TruncSat:
        return BinaryConsts::CustomSections::TruncSatFeature;
      case FeatureSet::SIMD:
        return BinaryConsts::CustomSections::SIMD128Feature;
      case FeatureSet::BulkMemory:
        return BinaryConsts::CustomSections::BulkMemoryFeature;
      case FeatureSet::SignExt:
        return BinaryConsts::CustomSections::SignExtFeature;
      case FeatureSet::ExceptionHandling:
        return BinaryConsts::CustomSections::ExceptionHandlingFeature;
      case FeatureSet::TailCall:
        return BinaryConsts::CustomSections::TailCallFeature;
      case FeatureSet::ReferenceTypes:
        return BinaryConsts::CustomSections::ReferenceTypesFeature;
      case FeatureSet::Multivalue:
        return BinaryConsts::CustomSections::MultivalueFeature;
      case FeatureSet::GC:
        return BinaryConsts::CustomSections::GCFeature;
      case FeatureSet::Memory64:
        return BinaryConsts::CustomSections::Memory64Feature;
      case FeatureSet::RelaxedSIMD:
        return BinaryConsts::CustomSections::RelaxedSIMDFeature;
      case FeatureSet::ExtendedConst:
        return BinaryConsts::CustomSections::ExtendedConstFeature;
      case FeatureSet::Strings:
        return BinaryConsts::CustomSections::StringsFeature;
      case FeatureSet::MultiMemory:
        return BinaryConsts::CustomSections::MultiMemoryFeature;
      case FeatureSet::StackSwitching:
        return BinaryConsts::CustomSections::StackSwitchingFeature;
      case FeatureSet::SharedEverything:
        return BinaryConsts::CustomSections::SharedEverythingFeature;
      case FeatureSet::FP16:
        return BinaryConsts::CustomSections::FP16Feature;
      case FeatureSet::BulkMemoryOpt:
        return BinaryConsts::CustomSections::BulkMemoryOptFeature;
      case FeatureSet::CallIndirectOverlong:
        return BinaryConsts::CustomSections::CallIndirectOverlongFeature;
      case FeatureSet::CustomDescriptors:
        return BinaryConsts::CustomSections::CustomDescriptorsFeature;
      case FeatureSet::None:
      case FeatureSet::Default:
      case FeatureSet::All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature flag");
  };

  std::vector<const char*> features;
  wasm->features.iterFeatures(
    [&](FeatureSet::Feature f) { features.push_back(toString(f)); });

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::TargetFeatures);
  o << U32LEB(features.size());
  for (auto& f : features) {
    o << uint8_t(BinaryConsts::FeatureUsed);
    writeInlineString(f);
  }
  finishSection(start);
}